

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageIO.cpp
# Opt level: O1

Image * nv::ImageIO::loadPSD(Stream *s)

{
  bool bVar1;
  ushort uVar2;
  int iVar3;
  Stream *pSVar4;
  Image *this;
  Color32 *pCVar5;
  char *__s;
  uint uVar6;
  ulong uVar7;
  undefined1 *puVar8;
  long lVar9;
  AutoPtr<nv::Image> AVar10;
  uint uVar11;
  ulong uVar13;
  uint8 val;
  uint8 c;
  AutoPtr<nv::Image> img;
  uint16 compression;
  PsdHeader header;
  int tmp;
  undefined1 local_76;
  byte local_75;
  uint local_74;
  AutoPtr<nv::Image> local_70;
  ushort local_66;
  int local_64;
  short local_60 [4];
  ushort local_58 [2];
  uint local_54;
  uint local_50;
  short local_4c;
  short local_4a;
  ulong local_48;
  ulong local_40;
  anon_union_4_2_12391d8d_for_Color32_0 local_38;
  int local_34;
  uint uVar12;
  
  iVar3 = (*s->_vptr_Stream[6])();
  if (((char)iVar3 != '\0') &&
     (iVar3 = nvAbort("!s.isError()",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/ImageIO.cpp"
                      ,0x1c3,"Image *nv::ImageIO::loadPSD(Stream &)"), iVar3 == 1)) {
    raise(5);
  }
  iVar3 = (*s->_vptr_Stream[10])(s);
  if (((char)iVar3 == '\0') &&
     (iVar3 = nvAbort("s.isLoading()",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/ImageIO.cpp"
                      ,0x1c4,"Image *nv::ImageIO::loadPSD(Stream &)"), iVar3 == 1)) {
    raise(5);
  }
  s->m_byteOrder = BigEndian;
  pSVar4 = Stream::byteOrderSerialize(s,&local_64,4);
  Stream::byteOrderSerialize(pSVar4,local_60,2);
  lVar9 = 6;
  do {
    (*s->_vptr_Stream[2])(s,(long)local_60 + lVar9 + -4,1);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0xc);
  pSVar4 = Stream::byteOrderSerialize(s,local_58,2);
  pSVar4 = Stream::byteOrderSerialize(pSVar4,&local_54,4);
  pSVar4 = Stream::byteOrderSerialize(pSVar4,&local_50,4);
  pSVar4 = Stream::byteOrderSerialize(pSVar4,&local_4c,2);
  Stream::byteOrderSerialize(pSVar4,&local_4a,2);
  if (local_64 == 0x38425053) {
    if (local_60[0] == 1) {
      if (((local_58[0] < 5) && (local_4c == 8)) && (local_4a == 3)) {
        Stream::byteOrderSerialize(s,&local_34,4);
        iVar3 = (*s->_vptr_Stream[4])(s);
        (*s->_vptr_Stream[3])(s,(ulong)(uint)(iVar3 + local_34));
        Stream::byteOrderSerialize(s,&local_34,4);
        iVar3 = (*s->_vptr_Stream[4])(s);
        (*s->_vptr_Stream[3])(s,(ulong)(uint)(iVar3 + local_34));
        Stream::byteOrderSerialize(s,&local_34,4);
        iVar3 = (*s->_vptr_Stream[4])(s);
        (*s->_vptr_Stream[3])(s,(ulong)(uint)(iVar3 + local_34));
        Stream::byteOrderSerialize(s,&local_66,2);
        uVar2 = local_58[0];
        if (1 < local_66) {
          return (Image *)0x0;
        }
        uVar13 = (ulong)local_58[0];
        this = (Image *)operator_new(0x18);
        Image::Image(this);
        local_70.m_ptr = this;
        Image::allocate(this,local_50,local_54);
        if (uVar2 < 4) {
          local_38.u = 0xff000000;
          Image::fill(local_70.m_ptr,(Color32 *)&local_38.field_0);
        }
        else {
          uVar13 = 4;
          Image::setFormat(local_70.m_ptr,Format_ARGB);
        }
        local_74 = local_50 * local_54;
        if (local_66 == 0) {
          if ((int)uVar13 != 0) {
            uVar7 = 0;
            do {
              pCVar5 = Image::pixels(local_70.m_ptr);
              if (local_74 != 0) {
                lVar9 = (long)&pCVar5->field_0 + (ulong)loadPSD::components[uVar7];
                uVar6 = local_74;
                do {
                  (*s->_vptr_Stream[2])(s,lVar9,1);
                  lVar9 = lVar9 + 4;
                  uVar6 = uVar6 - 1;
                } while (uVar6 != 0);
              }
              uVar7 = uVar7 + 1;
            } while (uVar7 != uVar13);
          }
        }
        else {
          iVar3 = (*s->_vptr_Stream[4])(s);
          (*s->_vptr_Stream[3])(s,(ulong)(iVar3 + local_58[0] * local_54 * 2));
          if ((int)uVar13 != 0) {
            AVar10.m_ptr = (Image *)0x0;
            uVar7 = 0;
            local_48 = uVar13;
            do {
              pCVar5 = Image::pixels(local_70.m_ptr);
              puVar8 = (undefined1 *)((long)&pCVar5->field_0 + (ulong)loadPSD::components[uVar7]);
              uVar6 = 0;
              local_40 = uVar7;
              while (uVar6 < local_74) {
                iVar3 = (*s->_vptr_Stream[8])(s);
                if ((char)iVar3 != '\0') goto LAB_001c35fd;
                (*s->_vptr_Stream[2])(s,&local_75,1);
                uVar11 = (uint)local_75;
                uVar12 = (uint)local_75;
                if ((char)local_75 < '\0') {
                  bVar1 = true;
                  if (uVar12 != 0x80) {
                    iVar3 = (*s->_vptr_Stream[8])(s);
                    uVar6 = (uVar6 - uVar12) + 0x101;
                    if ((char)iVar3 != '\0' || local_74 < uVar6) goto LAB_001c3543;
                    (*s->_vptr_Stream[2])(s,&local_76,1);
                    iVar3 = uVar11 - 0x101;
                    do {
                      *puVar8 = local_76;
                      puVar8 = puVar8 + 4;
                      iVar3 = iVar3 + 1;
                    } while (iVar3 != 0);
                  }
                }
                else {
                  uVar6 = uVar6 + uVar11 + 1;
                  if (local_74 < uVar6) {
LAB_001c3543:
                    bVar1 = false;
                  }
                  else {
                    iVar3 = uVar12 + 1;
                    do {
                      (*s->_vptr_Stream[2])(s,puVar8,1);
                      puVar8 = puVar8 + 4;
                      iVar3 = iVar3 + -1;
                    } while (iVar3 != 0);
                    bVar1 = true;
                  }
                }
                if (!bVar1) goto LAB_001c35fd;
              }
              uVar7 = local_40 + 1;
            } while (uVar7 != local_48);
          }
        }
        AVar10.m_ptr = local_70.m_ptr;
        local_70.m_ptr = (Image *)0x0;
LAB_001c35fd:
        AutoPtr<nv::Image>::~AutoPtr(&local_70);
        return AVar10.m_ptr;
      }
    }
    else {
      nvDebug("*** bad version number %u\n");
    }
    __s = "unsupported file!";
  }
  else {
    __s = "invalid header!";
  }
  puts(__s);
  return (Image *)0x0;
}

Assistant:

Image * nv::ImageIO::loadPSD(Stream & s)
{
	nvCheck(!s.isError());
	nvCheck(s.isLoading());
	
	s.setByteOrder(Stream::BigEndian);
	
	PsdHeader header;
	s << header;
	
	if (!header.isValid())
	{
		printf("invalid header!\n");
		return NULL;
	}
	
	if (!header.isSupported())
	{
		printf("unsupported file!\n");
		return NULL;
	}
	
	int tmp;
	
	// Skip mode data.
	s << tmp;
	s.seek(s.tell() + tmp);

	// Skip image resources.
	s << tmp;
	s.seek(s.tell() + tmp);
	
	// Skip the reserved data.
	s << tmp;
	s.seek(s.tell() + tmp);
	
	// Find out if the data is compressed.
	// Known values:
	//   0: no compression
	//   1: RLE compressed
	uint16 compression;
	s << compression;
	
	if (compression > 1) {
		// Unknown compression type.
		return NULL;
	}
	
	uint channel_num = header.channel_count;
	
	AutoPtr<Image> img(new Image());
	img->allocate(header.width, header.height);
	
	if (channel_num < 4)
	{
		// Clear the image.
		img->fill(Color32(0, 0, 0, 0xFF));
	}
	else
	{
		// Enable alpha.
		img->setFormat(Image::Format_ARGB);
		
		// Ignore remaining channels.
		channel_num = 4;
	}
	
	
	const uint pixel_count = header.height * header.width;
	
	static const uint components[4] = {2, 1, 0, 3};
	
	if (compression)
	{
		s.seek(s.tell() + header.height * header.channel_count * sizeof(uint16));
		
		// Read RLE data.						
		for (uint channel = 0; channel < channel_num; channel++)
		{
			uint8 * ptr = (uint8 *)img->pixels() + components[channel];
			
			uint count = 0;
			while( count < pixel_count )
			{
				if (s.isAtEnd()) return NULL;
				
				uint8 c;
				s << c;
				
				uint len = c;
				if (len < 128)
				{
					// Copy next len+1 bytes literally.
					len++;
					count += len;
					if (count > pixel_count) return NULL;
	
					while (len != 0)
					{
						s << *ptr;
						ptr += 4;
						len--;
					}
				} 
				else if (len > 128)
				{
					// Next -len+1 bytes in the dest are replicated from next source byte.
					// (Interpret len as a negative 8-bit int.)
					len ^= 0xFF;
					len += 2;
					count += len;
					if (s.isAtEnd() || count > pixel_count) return NULL;
					
					uint8 val;
					s << val;
					while( len != 0 ) {
						*ptr = val;
						ptr += 4;
						len--;
					}
				}
				else if( len == 128 ) {
					// No-op.
				}
			}
		}
	}
	else
	{
		// We're at the raw image data. It's each channel in order (Red, Green, Blue, Alpha, ...)
		// where each channel consists of an 8-bit value for each pixel in the image.
		
		// Read the data by channel.
		for (uint channel = 0; channel < channel_num; channel++)
		{
			uint8 * ptr = (uint8 *)img->pixels() + components[channel];
			
			// Read the data.
			uint count = pixel_count;
			while (count != 0)
			{
				s << *ptr;
				ptr += 4;
				count--;
			}
		}
	}

	return img.release();
}